

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_mm_callcomp(jit_State *J,RecordIndex *ix,int op)

{
  BCReg func_00;
  TRef *pTVar1;
  TValue *pTVar2;
  code *cont;
  TValue *tv;
  TRef *base;
  BCReg func;
  int op_local;
  RecordIndex *ix_local;
  jit_State *J_local;
  
  cont = lj_cont_condt;
  if ((op & 1U) != 0) {
    cont = lj_cont_condf;
  }
  func_00 = rec_mm_prep(J,cont);
  pTVar1 = J->base + func_00;
  pTVar2 = J->L->base + func_00;
  *pTVar1 = ix->mobj;
  pTVar1[2] = ix->val;
  pTVar1[3] = ix->key;
  *pTVar2 = ix->mobjv;
  pTVar2[2] = ix->valv;
  pTVar2[3] = ix->keyv;
  lj_record_call(J,func_00,2);
  return;
}

Assistant:

static void rec_mm_callcomp(jit_State *J, RecordIndex *ix, int op)
{
  BCReg func = rec_mm_prep(J, (op&1) ? lj_cont_condf : lj_cont_condt);
  TRef *base = J->base + func + LJ_FR2;
  TValue *tv = J->L->base + func + LJ_FR2;
  base[-LJ_FR2] = ix->mobj; base[1] = ix->val; base[2] = ix->key;
  copyTV(J->L, tv-LJ_FR2, &ix->mobjv);
  copyTV(J->L, tv+1, &ix->valv);
  copyTV(J->L, tv+2, &ix->keyv);
  lj_record_call(J, func, 2);
}